

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quass.cpp
# Opt level: O0

void loginformation(Runtime *rt,Basis *basis,CholeskyFactor *factor,HighsTimer *timer)

{
  uint uVar1;
  int iVar2;
  vector<double,_std::allocator<double>_> *this;
  Instance *in_RCX;
  vector<double,_std::allocator<double>_> *this_00;
  size_t __nbytes;
  void *__buf;
  long in_RDI;
  SumNum sm;
  value_type_conflict1 *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar3;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QpVector *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff80,
             (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  this_00 = (vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x8d8) + 0x30);
  iVar3 = *(int *)(in_RDI + 4);
  uVar1 = Basis::getnumactive((Basis *)0x75db5f);
  __nbytes = (size_t)uVar1;
  iVar2 = iVar3 - uVar1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)this_00,
             (value_type_conflict2 *)in_stack_ffffffffffffff68);
  this = (vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x8d8) + 0x48);
  Instance::objval(in_RCX,(QpVector *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
  std::vector<double,_std::allocator<double>_>::push_back(this_00,in_stack_ffffffffffffff68);
  HighsTimer::read((HighsTimer *)in_RCX,0,__buf,__nbytes);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,in_stack_ffffffffffffff68);
  Instance::sumnumprimalinfeasibilities
            ((Instance *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,
             (QpVector *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  std::vector<double,_std::allocator<double>_>::push_back
            (this,(value_type_conflict1 *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)this,
             (value_type_conflict2 *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
  CholeskyFactor::density((CholeskyFactor *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
  std::vector<double,_std::allocator<double>_>::push_back(this_00,in_stack_ffffffffffffff68);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,in_stack_ffffffffffffff68);
  return;
}

Assistant:

static void loginformation(Runtime& rt, Basis& basis, CholeskyFactor& factor,
                           HighsTimer& timer) {
  rt.statistics.iteration.push_back(rt.statistics.num_iterations);
  rt.statistics.nullspacedimension.push_back(rt.instance.num_var -
                                             basis.getnumactive());
  rt.statistics.objval.push_back(rt.instance.objval(rt.primal));
  rt.statistics.time.push_back(timer.read());
  SumNum sm =
      rt.instance.sumnumprimalinfeasibilities(rt.primal, rt.rowactivity);
  rt.statistics.sum_primal_infeasibilities.push_back(sm.sum);
  rt.statistics.num_primal_infeasibilities.push_back(sm.num);
  rt.statistics.density_factor.push_back(factor.density());
  rt.statistics.density_nullspace.push_back(0.0);
}